

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

void ZSTD_copyBlockSequences(ZSTD_CCtx *zc)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  ZSTD_longLengthType_e ZVar4;
  seqDef *psVar5;
  seqDef *psVar6;
  ZSTD_compressedBlockState_t *pZVar7;
  ulong uVar8;
  ZSTD_Sequence *pZVar9;
  uint uVar10;
  U32 *pUVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  ZSTD_Sequence *pZVar19;
  ulong uVar20;
  undefined8 local_58;
  U32 local_50 [2];
  BYTE *local_48;
  BYTE *local_40;
  size_t local_38;
  
  local_38 = (zc->seqCollector).seqIndex;
  psVar5 = (zc->seqStore).sequencesStart;
  pZVar9 = (zc->seqCollector).seqStart + local_38;
  psVar6 = (zc->seqStore).sequences;
  local_40 = (zc->seqStore).lit;
  local_48 = (zc->seqStore).litStart;
  pZVar7 = (zc->blockState).prevCBlock;
  local_50[0] = pZVar7->rep[2];
  lVar13 = (long)psVar6 - (long)psVar5 >> 3;
  local_58 = *(ulong *)pZVar7->rep;
  if (psVar6 == psVar5) {
    uVar17 = 0;
    iVar18 = 0;
  }
  else {
    uVar3 = (zc->seqStore).longLengthPos;
    uVar17 = lVar13 + (ulong)(lVar13 == 0);
    iVar18 = 0;
    uVar20 = 0;
    pZVar19 = pZVar9;
    do {
      uVar10 = psVar5[uVar20].offset;
      uVar1 = psVar5[uVar20].litLength;
      uVar15 = (uint)uVar1;
      pZVar19->litLength = (uint)uVar1;
      uVar2 = psVar5[uVar20].matchLength;
      pZVar19->matchLength = uVar2 + 3;
      pZVar19->rep = 0;
      uVar12 = (uint)uVar1;
      if (uVar3 == uVar20) {
        ZVar4 = (zc->seqStore).longLengthType;
        uVar12 = uVar15;
        if (ZVar4 == ZSTD_llt_matchLength) {
          pZVar19->matchLength = uVar2 + 0x10003;
        }
        else if (ZVar4 == ZSTD_llt_literalLength) {
          pZVar19->litLength = uVar15 + 0x10000;
          uVar12 = uVar15 + 0x10000;
        }
      }
      pUVar11 = (U32 *)((long)&local_58 + 4);
      if (uVar10 < 4) {
        pZVar19->rep = uVar10;
        if (uVar12 == 0) {
          uVar14 = uVar10;
          if (uVar10 != 3) goto LAB_001bacac;
          pZVar19->offset = (int)local_58 - 1;
          uVar10 = 2;
        }
        else {
          uVar14 = uVar10 - 1;
LAB_001bacac:
          uVar10 = uVar10 - 1;
          pZVar19->offset = local_50[(ulong)uVar14 - 2];
          uVar16 = 0xfffffffd;
          if (2 < uVar10) goto LAB_001bacc3;
        }
        uVar10 = (uVar15 == 0) + uVar10;
        if (uVar10 == 0) {
          uVar8 = local_58 >> 0x20;
          pUVar11 = local_50;
        }
        else {
          if (uVar10 == 3) {
            uVar15 = (int)local_58 - 1;
          }
          else {
            uVar15 = local_50[(ulong)uVar10 - 2];
          }
          uVar8 = local_58 & 0xffffffff;
          local_58 = (ulong)uVar15;
          if (uVar10 == 1) {
            pUVar11 = local_50;
          }
        }
      }
      else {
        uVar16 = (ulong)(uVar10 - 3);
        pZVar19->offset = uVar10 - 3;
LAB_001bacc3:
        uVar8 = local_58 & 0xffffffff;
        local_58 = uVar16;
      }
      local_58 = local_58 & 0xffffffff | uVar8 << 0x20;
      local_50[0] = *pUVar11;
      iVar18 = iVar18 + uVar12;
      uVar20 = uVar20 + 1;
      pZVar19 = pZVar19 + 1;
    } while (uVar17 != uVar20);
  }
  pZVar9[uVar17].litLength = (int)local_40 - (iVar18 + (int)local_48);
  pZVar9[uVar17].offset = 0;
  pZVar9[uVar17].matchLength = 0;
  pZVar9[uVar17].rep = 0;
  (zc->seqCollector).seqIndex = lVar13 + local_38 + 1;
  return;
}

Assistant:

static void ZSTD_copyBlockSequences(ZSTD_CCtx* zc)
{
    const seqStore_t* seqStore = ZSTD_getSeqStore(zc);
    const seqDef* seqStoreSeqs = seqStore->sequencesStart;
    size_t seqStoreSeqSize = seqStore->sequences - seqStoreSeqs;
    size_t seqStoreLiteralsSize = (size_t)(seqStore->lit - seqStore->litStart);
    size_t literalsRead = 0;
    size_t lastLLSize;

    ZSTD_Sequence* outSeqs = &zc->seqCollector.seqStart[zc->seqCollector.seqIndex];
    size_t i;
    repcodes_t updatedRepcodes;

    assert(zc->seqCollector.seqIndex + 1 < zc->seqCollector.maxSequences);
    /* Ensure we have enough space for last literals "sequence" */
    assert(zc->seqCollector.maxSequences >= seqStoreSeqSize + 1);
    ZSTD_memcpy(updatedRepcodes.rep, zc->blockState.prevCBlock->rep, sizeof(repcodes_t));
    for (i = 0; i < seqStoreSeqSize; ++i) {
        U32 rawOffset = seqStoreSeqs[i].offset - ZSTD_REP_NUM;
        outSeqs[i].litLength = seqStoreSeqs[i].litLength;
        outSeqs[i].matchLength = seqStoreSeqs[i].matchLength + MINMATCH;
        outSeqs[i].rep = 0;

        if (i == seqStore->longLengthPos) {
            if (seqStore->longLengthType == ZSTD_llt_literalLength) {
                outSeqs[i].litLength += 0x10000;
            } else if (seqStore->longLengthType == ZSTD_llt_matchLength) {
                outSeqs[i].matchLength += 0x10000;
            }
        }

        if (seqStoreSeqs[i].offset <= ZSTD_REP_NUM) {
            /* Derive the correct offset corresponding to a repcode */
            outSeqs[i].rep = seqStoreSeqs[i].offset;
            if (outSeqs[i].litLength != 0) {
                rawOffset = updatedRepcodes.rep[outSeqs[i].rep - 1];
            } else {
                if (outSeqs[i].rep == 3) {
                    rawOffset = updatedRepcodes.rep[0] - 1;
                } else {
                    rawOffset = updatedRepcodes.rep[outSeqs[i].rep];
                }
            }
        }
        outSeqs[i].offset = rawOffset;
        /* seqStoreSeqs[i].offset == offCode+1, and ZSTD_updateRep() expects offCode
           so we provide seqStoreSeqs[i].offset - 1 */
        updatedRepcodes = ZSTD_updateRep(updatedRepcodes.rep,
                                         seqStoreSeqs[i].offset - 1,
                                         seqStoreSeqs[i].litLength == 0);
        literalsRead += outSeqs[i].litLength;
    }
    /* Insert last literals (if any exist) in the block as a sequence with ml == off == 0.
     * If there are no last literals, then we'll emit (of: 0, ml: 0, ll: 0), which is a marker
     * for the block boundary, according to the API.
     */
    assert(seqStoreLiteralsSize >= literalsRead);
    lastLLSize = seqStoreLiteralsSize - literalsRead;
    outSeqs[i].litLength = (U32)lastLLSize;
    outSeqs[i].matchLength = outSeqs[i].offset = outSeqs[i].rep = 0;
    seqStoreSeqSize++;
    zc->seqCollector.seqIndex += seqStoreSeqSize;
}